

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.hpp
# Opt level: O0

rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
* __thiscall
boost::spirit::classic::
rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
::operator=(rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
            *this,eol_parser *p)

{
  abstract_parser<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t>
  *p_00;
  eol_parser *in_RDI;
  eol_parser *this_00;
  scoped_ptr<boost::spirit::classic::impl::abstract_parser<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  p_00 = (abstract_parser<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t>
          *)operator_new(0x10);
  impl::
  concrete_parser<boost::spirit::classic::eol_parser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t>
  ::concrete_parser((concrete_parser<boost::spirit::classic::eol_parser,_boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t>
                     *)this_00,in_RDI);
  scoped_ptr<boost::spirit::classic::impl::abstract_parser<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t>_>
  ::reset(in_stack_ffffffffffffffe0,p_00);
  return (rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
          *)this_00;
}

Assistant:

rule& operator=(ParserT const& p)
        {
            ptr.reset(new impl::concrete_parser<ParserT, scanner_t, attr_t>(p));
            return *this;
        }